

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O0

int xercesc_4_0::RegularExpression::getOptionValue(XMLCh ch)

{
  int local_10;
  int ret;
  XMLCh ch_local;
  
  local_10 = 0;
  switch(ch) {
  case L'F':
    local_10 = 0x100;
    break;
  default:
    break;
  case L'H':
    local_10 = 0x80;
    break;
  case L'X':
    local_10 = 0x200;
    break;
  case L'i':
    local_10 = 2;
    break;
  case L'm':
    local_10 = 8;
    break;
  case L's':
    local_10 = 4;
    break;
  case L'x':
    local_10 = 0x10;
  }
  return local_10;
}

Assistant:

int RegularExpression::getOptionValue(const XMLCh ch) {

    int ret = 0;

    switch (ch) {

        case chLatin_i:
            ret = IGNORE_CASE;
            break;
        case chLatin_m:
            ret = MULTIPLE_LINE;
            break;
        case chLatin_s:
            ret = SINGLE_LINE;
            break;
        case chLatin_x:
            ret = EXTENDED_COMMENT;
            break;
        case chLatin_F:
            ret = PROHIBIT_FIXED_STRING_OPTIMIZATION;
            break;
        case chLatin_H:
            ret = PROHIBIT_HEAD_CHARACTER_OPTIMIZATION;
            break;
        case chLatin_X:
            ret = XMLSCHEMA_MODE;
            break;
        default:
            break;
    }

    return ret;
}